

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopInvariantCodeMotion.cpp
# Opt level: O1

bool __thiscall
wasm::LoopInvariantCodeMotion::hasGetDependingOnLoopSet
          (LoopInvariantCodeMotion *this,Expression *curr,LoopSets *loopSets)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  LocalSet **ppLVar4;
  _Rb_tree_const_iterator<wasm::LocalSet_*> _Var5;
  byte bVar6;
  undefined1 local_a8 [8];
  Iterator __end3;
  FindAll<wasm::LocalGet> gets;
  LocalSet *set;
  undefined1 local_58 [8];
  Iterator __begin3;
  
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)&__end3.flexibleIterator,curr);
  __begin3.flexibleIterator._M_node._7_1_ =
       __end3.flexibleIterator._M_node !=
       (_Base_ptr)
       gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((bool)__begin3.flexibleIterator._M_node._7_1_) {
    _Var5 = __end3.flexibleIterator;
    do {
      local_a8 = (undefined1  [8])
                 LazyLocalGraph::getSets(this->localGraph,*(LocalGet **)_Var5._M_node);
      sVar1 = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                 *)local_a8)->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end3.parent._0_1_ = sVar1 == 0;
      __begin3.fixedIndex = 0;
      if ((bool)__end3.parent._0_1_) {
        __begin3.usingFixed = false;
        __begin3._9_7_ = 0;
      }
      else {
        __begin3.fixedIndex =
             (size_t)(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                        *)local_a8)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      __end3.fixedIndex = 0;
      local_58 = local_a8;
      __begin3.parent._0_1_ = __end3.parent._0_1_;
      if (sVar1 == 0) {
        __end3._8_8_ = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                          *)&((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                               *)local_a8)->fixed)->fixed).
                       super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
      }
      else {
        __end3.fixedIndex =
             (size_t)&(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         *)local_a8)->flexible)._M_t._M_impl.super__Rb_tree_header;
      }
      while( true ) {
        bVar2 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ::
                IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                              *)local_58,(Iterator *)local_a8);
        if (bVar2) break;
        ppLVar4 = (LocalSet **)(__begin3.fixedIndex + 0x20);
        if ((char)__begin3.parent != '\0') {
          ppLVar4 = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       *)local_58)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
                    _M_elems + __begin3._8_8_;
        }
        gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*ppLVar4;
        if ((LocalSet *)
            gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage == (LocalSet *)0x0) {
          bVar6 = 5;
        }
        else {
          sVar3 = std::
                  _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&loopSets->_M_h,
                          (key_type *)
                          &gets.list.
                           super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar6 = sVar3 != 0;
        }
        if ((bVar6 != 5) && (bVar6 != 0)) goto LAB_009540d4;
        if ((char)__begin3.parent == '\x01') {
          __begin3._8_8_ = __begin3._8_8_ + 1;
        }
        else {
          __begin3.fixedIndex = std::_Rb_tree_increment((_Rb_tree_node_base *)__begin3.fixedIndex);
        }
      }
      bVar6 = 0;
LAB_009540d4:
      if ((bVar6 & 3) != 0) break;
      _Var5._M_node = (_Base_ptr)&(_Var5._M_node)->_M_parent;
      __begin3.flexibleIterator._M_node._7_1_ =
           _Var5._M_node !=
           (_Base_ptr)
           gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl
           .super__Vector_impl_data._M_start;
    } while ((bool)__begin3.flexibleIterator._M_node._7_1_);
  }
  if (__end3.flexibleIterator._M_node != (_Base_ptr)0x0) {
    operator_delete(__end3.flexibleIterator._M_node,
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)__end3.flexibleIterator._M_node);
  }
  return (bool)(__begin3.flexibleIterator._M_node._7_1_ & 1);
}

Assistant:

bool hasGetDependingOnLoopSet(Expression* curr, LoopSets& loopSets) {
    FindAll<LocalGet> gets(curr);
    for (auto* get : gets.list) {
      auto& sets = localGraph->getSets(get);
      for (auto* set : sets) {
        // nullptr means a parameter or zero-init value;
        // no danger to us.
        if (!set) {
          continue;
        }
        // Check if the set is in the loop. If not, it's either before,
        // which is fine, or after, which is also fine - moving curr
        // to just outside the loop will preserve those relationships.
        // TODO: this still counts curr's sets as inside the loop, which
        //       might matter in non-flat mode.
        if (loopSets.count(set)) {
          return true;
        }
      }
    }
    return false;
  }